

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::HandleRlyRx(CommissionerImpl *this,Request *aRlyRx)

{
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  ErrorCode EVar3;
  ushort uVar4;
  int iVar5;
  Error *pEVar6;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ByteArray *pBVar8;
  char *pcVar9;
  iterator __position;
  char *pcVar10;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *extraout_RDX_02;
  ByteArray *extraout_RDX_03;
  ByteArray *extraout_RDX_04;
  ByteArray *extraout_RDX_05;
  ByteArray *extraout_RDX_06;
  ByteArray *extraout_RDX_07;
  ByteArray *extraout_RDX_08;
  TimePoint *extraout_RDX_09;
  TimePoint *extraout_RDX_10;
  TimePoint *extraout_RDX_11;
  TimePoint *aTimePoint;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_bool>
  pVar11;
  allocator local_21b;
  uint16_t joinerRouterLocator;
  undefined1 local_218 [8];
  _Head_base<7UL,_ot::commissioner::Address_&,_false> _Stack_210;
  char *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_200;
  _Head_base<3UL,_unsigned_short_&,_false> local_1f0;
  _Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_1e8;
  _Head_base<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false> _Stack_1e0;
  _Head_base<0UL,_ot::commissioner::CommissionerImpl_&,_false> local_1d8;
  string local_1d0;
  uint16_t joinerUdpPort;
  writer write;
  Address *pAStack_1a0;
  string peerAddr;
  ByteArray joinerId;
  Error error;
  TlvPtr tlv;
  writer write_4;
  ByteArray dtlsRecords;
  Address localAddr;
  ByteArray joinerIid;
  TlvSet tlvSet;
  string joinerPSKd;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tlvSet._M_t._M_impl.super__Rb_tree_header._M_header;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  joinerPSKd._M_dataplus._M_p = (pointer)&joinerPSKd.field_2;
  joinerPSKd._M_string_length = 0;
  tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  joinerPSKd.field_2._M_local_buf[0] = '\0';
  joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  commissioner::tlv::GetTlvSet((Error *)local_218,&tlvSet,&aRlyRx->mPayload,kMeshCoP);
  pEVar6 = Error::operator=(&error,(Error *)local_218);
  EVar3 = pEVar6->mCode;
  std::__cxx11::string::~string((string *)&_Stack_210);
  if (EVar3 != kNone) goto LAB_001a0602;
  local_218[0] = (string)0x12;
  p_Var7 = &std::
            map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
            ::operator[](&tlvSet,(key_type *)local_218)->
            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,p_Var7)
  ;
  if (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_218 = (undefined1  [8])((ulong)((uint7)local_218._1_7_ >> 0x18) << 0x20);
    _Stack_210._M_head_impl = (Address *)0x215cec;
    local_208 = (char *)0x22;
    aStack_200._M_allocated_capacity = 0;
    local_1f0._M_head_impl = (unsigned_short *)0x0;
    pcVar9 = "no valid Joiner UDP Port TLV found";
    aStack_200._8_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_218;
    while (pcVar9 != "") {
      cVar2 = *pcVar9;
      pcVar10 = pcVar9;
      while (cVar2 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar9,"");
          goto LAB_0019ffb1;
        }
        cVar2 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar9,pcVar10);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_218);
    }
LAB_0019ffb1:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_218;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"no valid Joiner UDP Port TLV found",(string_view)ZEXT816(0x22),
               args);
    peerAddr._M_dataplus._M_p._0_4_ = 8;
    std::__cxx11::string::string((string *)&peerAddr._M_string_length,(string *)&local_1d0);
  }
  else {
    joinerUdpPort =
         commissioner::tlv::Tlv::GetValueAsUint16
                   (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    local_218[0] = (string)0x14;
    p_Var7 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)local_218)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var7);
    if (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      joinerRouterLocator =
           commissioner::tlv::Tlv::GetValueAsUint16
                     (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
      local_218[0] = (string)0x13;
      p_Var7 = &std::
                map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                ::operator[](&tlvSet,(key_type *)local_218)->
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var7);
      if (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_218 = (undefined1  [8])((ulong)((uint7)local_218._1_7_ >> 0x18) << 0x20);
        _Stack_210._M_head_impl = (Address *)0x215d38;
        local_208 = (char *)0x1d;
        aStack_200._M_allocated_capacity = 0;
        local_1f0._M_head_impl = (unsigned_short *)0x0;
        pcVar9 = "no valid Joiner IID TLV found";
        aStack_200._8_8_ =
             (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218;
        while (pcVar10 = pcVar9, pcVar10 != "") {
          pcVar9 = pcVar10 + 1;
          if (*pcVar10 == '}') {
            if ((pcVar9 == "") || (*pcVar9 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar9 = pcVar10 + 2;
          }
          else if (*pcVar10 == '{') {
            pcVar9 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar10,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_218);
          }
        }
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_218;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_1d0,(v10 *)"no valid Joiner IID TLV found",(string_view)ZEXT816(0x1d),
                   args_01);
        peerAddr._M_dataplus._M_p._0_4_ = 8;
        std::__cxx11::string::string((string *)&peerAddr._M_string_length,(string *)&local_1d0);
        Error::operator=(&error,(Error *)&peerAddr);
        std::__cxx11::string::~string((string *)&peerAddr._M_string_length);
        std::__cxx11::string::~string((string *)&local_1d0);
        goto LAB_001a0602;
      }
      pBVar8 = commissioner::tlv::Tlv::GetValue
                         (tlv.
                          super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&joinerIid,pBVar8);
      local_218[0] = (string)0x11;
      p_Var7 = &std::
                map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                ::operator[](&tlvSet,(key_type *)local_218)->
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var7);
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_218;
      if (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
        _Stack_210._M_head_impl = (Address *)0x215d56;
        local_208 = (char *)0x2c;
        aStack_200._M_allocated_capacity = 0;
        local_1f0._M_head_impl = (unsigned_short *)0x0;
        pcVar9 = "no valid Joiner DTLS Encapsulation TLV found";
        aStack_200._8_8_ =
             (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218;
        while (pcVar9 != "") {
          cVar2 = *pcVar9;
          pcVar10 = pcVar9;
          while (cVar2 != '{') {
            pcVar10 = pcVar10 + 1;
            if (pcVar10 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write,pcVar9,"");
              goto LAB_001a059c;
            }
            cVar2 = *pcVar10;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar9,pcVar10);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_218);
        }
LAB_001a059c:
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)local_218;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_1d0,(v10 *)"no valid Joiner DTLS Encapsulation TLV found",
                   (string_view)ZEXT816(0x2c),args_03);
        peerAddr._M_dataplus._M_p._0_4_ = 8;
        std::__cxx11::string::string((string *)&peerAddr._M_string_length,(string *)&local_1d0);
        goto LAB_001a05d3;
      }
      pBVar8 = commissioner::tlv::Tlv::GetValue
                         (tlv.
                          super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&dtlsRecords,pBVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&joinerId,&joinerIid);
      *joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           *joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ^ 2;
      std::__cxx11::string::string((string *)&peerAddr,"joiner-session",(allocator *)&write_4);
      local_218 = (undefined1  [8])0x20000000d;
      _Stack_210._M_head_impl._0_4_ = 4;
      local_208 = "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}";
      aStack_200._M_allocated_capacity = 0x43;
      aStack_200._8_8_ = 0x300000000;
      local_1e8._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      _Stack_1e0._M_head_impl =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ::fmt::v10::detail::
           parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
      local_1d8._M_head_impl =
           (CommissionerImpl *)
           ::fmt::v10::detail::
           parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar9 = "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}";
      pBVar8 = extraout_RDX;
      local_1f0._M_head_impl = (unsigned_short *)local_218;
      while (pcVar9 != "") {
        cVar2 = *pcVar9;
        pcVar10 = pcVar9;
        while (cVar2 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
            ::writer::operator()((writer *)&write,pcVar9,"");
            pBVar8 = extraout_RDX_01;
            goto LAB_001a01b4;
          }
          cVar2 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
        ::writer::operator()((writer *)&write,pcVar9,pcVar10);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short,unsigned_long>&>
                           (pcVar10,"",
                            (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                             *)local_218);
        pBVar8 = extraout_RDX_00;
      }
LAB_001a01b4:
      utils::Hex_abi_cxx11_((string *)&write,(utils *)&joinerId,pBVar8);
      aStack_200._8_8_ =
           dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_208 = (char *)(ulong)joinerRouterLocator;
      local_218 = (undefined1  [8])write.handler_;
      _Stack_210._M_head_impl = pAStack_1a0;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_218;
      fmt.size_ = 0x42d;
      fmt.data_ = (char *)0x43;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1d0,
                 (v10 *)"received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",fmt,
                 args_02);
      Log(kDebug,&peerAddr,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&write);
      std::__cxx11::string::~string((string *)&peerAddr);
      this_00 = &this->mJoinerSessions;
      __position = std::
                   _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                   ::find(&this_00->_M_t,&joinerId);
      p_Var1 = &(this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_001a02a9:
        localAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        localAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        localAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (**this->mCommissionerHandler->_vptr_CommissionerHandler)
                  (local_218,this->mCommissionerHandler,&joinerId);
        std::__cxx11::string::operator=((string *)&joinerPSKd,(string *)local_218);
        std::__cxx11::string::~string((string *)local_218);
        if (joinerPSKd._M_string_length == 0) {
          std::__cxx11::string::string((string *)&peerAddr,"joiner-session",(allocator *)&write_4);
          local_218._0_4_ = 0xd;
          _Stack_210._M_head_impl = (Address *)0x215dc7;
          local_208 = (char *)0x19;
          aStack_200._M_allocated_capacity = 0x100000000;
          local_1f0._M_head_impl =
               (unsigned_short *)
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar9 = "joiner(ID={}) is disabled";
          pBVar8 = extraout_RDX_04;
          aStack_200._8_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_218;
          while (pcVar10 = pcVar9, pcVar10 != "") {
            pcVar9 = pcVar10 + 1;
            if (*pcVar10 == '}') {
              if ((pcVar9 == "") || (*pcVar9 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar9 = pcVar10 + 2;
            }
            else if (*pcVar10 == '{') {
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_218);
              pBVar8 = extraout_RDX_05;
            }
          }
          utils::Hex_abi_cxx11_((string *)local_218,(utils *)&joinerId,pBVar8);
          write.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_218;
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)&write;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = (char *)0x19;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_1d0,(v10 *)"joiner(ID={}) is disabled",fmt_01,args_05);
          Log(kInfo,&peerAddr,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)local_218);
          std::__cxx11::string::~string((string *)&peerAddr);
          local_218._0_4_ = 0xd;
          _Stack_210._M_head_impl = (Address *)0x215dc7;
          local_208 = (char *)0x19;
          aStack_200._M_allocated_capacity = 0x100000000;
          local_1f0._M_head_impl =
               (unsigned_short *)
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pBVar8 = extraout_RDX_06;
          pcVar9 = "joiner(ID={}) is disabled";
          aStack_200._8_8_ =
               (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218
          ;
          while (pcVar10 = pcVar9, pcVar10 != "") {
            pcVar9 = pcVar10 + 1;
            if (*pcVar10 == '}') {
              if ((pcVar9 == "") || (*pcVar9 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar9 = pcVar10 + 2;
            }
            else if (*pcVar10 == '{') {
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_218);
              pBVar8 = extraout_RDX_07;
            }
          }
          utils::Hex_abi_cxx11_((string *)local_218,(utils *)&joinerId,pBVar8);
          write.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_218;
          args_06.field_1.args_ = in_R9.args_;
          args_06.desc_ = (unsigned_long_long)&write;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = (char *)0x19;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_1d0,(v10 *)"joiner(ID={}) is disabled",fmt_02,args_06);
          peerAddr._M_dataplus._M_p._0_4_ = 0x10;
          std::__cxx11::string::string((string *)&peerAddr._M_string_length,(string *)&local_1d0);
          Error::operator=(&error,(Error *)&peerAddr);
          std::__cxx11::string::~string((string *)&peerAddr._M_string_length);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)local_218);
        }
        else {
          coap::CoapSecure::GetLocalAddr((Error *)local_218,&this->mBrClient,&localAddr);
          pEVar6 = Error::operator=(&error,(Error *)local_218);
          EVar3 = pEVar6->mCode;
          std::__cxx11::string::~string((string *)&_Stack_210);
          if (EVar3 == kNone) {
            local_1d0._M_dataplus._M_p = (pointer)&joinerId;
            (*aRlyRx->mEndpoint->_vptr_Endpoint[3])(&peerAddr);
            iVar5 = (*aRlyRx->mEndpoint->_vptr_Endpoint[4])();
            write.handler_._0_2_ = (short)iVar5;
            local_218 = (undefined1  [8])&kListeningJoinerPort;
            aStack_200._8_8_ = &joinerRouterLocator;
            local_1f0._M_head_impl = &joinerUdpPort;
            local_1e8._M_head_impl = &joinerPSKd;
            _Stack_1e0._M_head_impl = &joinerId;
            _Stack_210._M_head_impl = &localAddr;
            local_208 = (char *)&write;
            aStack_200._M_allocated_capacity = (size_type)&peerAddr;
            local_1d8._M_head_impl = this;
            pVar11 = std::
                     _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                     ::
                     _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&>,std::tuple<ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string&,unsigned_short&,unsigned_short&,ot::commissioner::Address&&,unsigned_short&&,ot::commissioner::Address&,unsigned_short_const&>>
                               ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                                 *)this_00,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                                 *)&local_1d0,
                                (tuple<ot::commissioner::CommissionerImpl_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_unsigned_short_&,_ot::commissioner::Address_&&,_unsigned_short_&&,_ot::commissioner::Address_&,_const_unsigned_short_&>
                                 *)local_218);
            __position._M_node = (_Base_ptr)pVar11.first._M_node;
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&peerAddr);
            (**(code **)(**(long **)(__position._M_node + 5) + 0x18))(local_218);
            Address::ToString_abi_cxx11_(&peerAddr,(Address *)local_218);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
            std::__cxx11::string::string((string *)&local_1d0,"joiner-session",&local_21b);
            local_218 = (undefined1  [8])0xd0000000d;
            _Stack_210._M_head_impl._0_4_ = 2;
            local_208 = "received a new joiner(ID={}) DTLS connection from [{}]:{}";
            aStack_200._M_allocated_capacity = 0x39;
            aStack_200._8_8_ = 0x300000000;
            local_1e8._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            _Stack_1e0._M_head_impl =
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_1d8._M_head_impl =
                 (CommissionerImpl *)
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
            pcVar9 = "received a new joiner(ID={}) DTLS connection from [{}]:{}";
            pBVar8 = extraout_RDX_02;
            local_1f0._M_head_impl = (unsigned_short *)local_218;
            write_4.handler_ =
                 (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_218;
            while (pcVar9 != "") {
              cVar2 = *pcVar9;
              pcVar10 = pcVar9;
              while (cVar2 != '{') {
                pcVar10 = pcVar10 + 1;
                if (pcVar10 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                  ::writer::operator()(&write_4,pcVar9,"");
                  pBVar8 = extraout_RDX_08;
                  goto LAB_001a09e2;
                }
                cVar2 = *pcVar10;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
              ::writer::operator()(&write_4,pcVar9,pcVar10);
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string,unsigned_short>&>
                                 (pcVar10,"",
                                  (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                                   *)local_218);
              pBVar8 = extraout_RDX_03;
            }
LAB_001a09e2:
            utils::Hex_abi_cxx11_((string *)&write_4,(utils *)&joinerId,pBVar8);
            uVar4 = (**(code **)(**(long **)(__position._M_node + 5) + 0x20))();
            aStack_200._8_8_ = ZEXT28(uVar4);
            local_218 = (undefined1  [8])write_4.handler_;
            aStack_200._M_allocated_capacity = peerAddr._M_string_length;
            args_07.field_1.args_ = in_R9.args_;
            args_07.desc_ = (unsigned_long_long)local_218;
            fmt_03.size_ = 0x2dd;
            fmt_03.data_ = (char *)0x39;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write,
                       (v10 *)"received a new joiner(ID={}) DTLS connection from [{}]:{}",fmt_03,
                       args_07);
            Log(kDebug,&local_1d0,(string *)&write);
            std::__cxx11::string::~string((string *)&write);
            std::__cxx11::string::~string((string *)&write_4);
            std::__cxx11::string::~string((string *)&local_1d0);
            JoinerSession::Connect((JoinerSession *)&__position._M_node[1]._M_right);
            std::__cxx11::string::string((string *)&local_1d0,"joiner-session",&local_21b);
            local_218._0_4_ = 0xd;
            _Stack_210._M_head_impl = (Address *)0x215e1b;
            local_208 = (char *)0x30;
            aStack_200._M_allocated_capacity = 0x100000000;
            local_1f0._M_head_impl =
                 (unsigned_short *)
                 ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar9 = "joiner session timer started, expiration-time={}";
            aTimePoint = extraout_RDX_09;
            aStack_200._8_8_ =
                 (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_218;
            write_4.handler_ =
                 (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_218;
            while (pcVar9 != "") {
              cVar2 = *pcVar9;
              pcVar10 = pcVar9;
              while (cVar2 != '{') {
                pcVar10 = pcVar10 + 1;
                if (pcVar10 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&write_4,pcVar9,"");
                  aTimePoint = extraout_RDX_11;
                  goto LAB_001a0b4d;
                }
                cVar2 = *pcVar10;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&write_4,pcVar9,pcVar10);
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_218);
              aTimePoint = extraout_RDX_10;
            }
LAB_001a0b4d:
            TimePointToString_abi_cxx11_
                      ((string *)local_218,(commissioner *)(__position._M_node + 0x19),aTimePoint);
            write_4.handler_ =
                 (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_218;
            args_08.field_1.args_ = in_R9.args_;
            args_08.desc_ = (unsigned_long_long)&write_4;
            fmt_04.size_ = 0xd;
            fmt_04.data_ = (char *)0x30;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write,(v10 *)"joiner session timer started, expiration-time={}",
                       fmt_04,args_08);
            Log(kInfo,&local_1d0,(string *)&write);
            std::__cxx11::string::~string((string *)&write);
            std::__cxx11::string::~string((string *)local_218);
            std::__cxx11::string::~string((string *)&local_1d0);
            Timer::Start(&this->mJoinerSessionTimer,
                         (duration)*(duration *)(__position._M_node + 0x19));
            std::__cxx11::string::~string((string *)&peerAddr);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&localAddr);
            goto LAB_001a0bf7;
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&localAddr);
      }
      else {
        if (*(int *)(*(long *)(__position._M_node + 5) + 0xf8) == 0) {
          std::
          _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
          ::erase_abi_cxx11_((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                              *)this_00,__position);
          goto LAB_001a02a9;
        }
LAB_001a0bf7:
        if ((_Rb_tree_header *)__position._M_node == p_Var1) {
          __assert_fail("condition",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                        ,0xa34,
                        "void ot::commissioner::CommissionerImpl::HandleRlyRx(const coap::Request &)"
                       );
        }
        JoinerSession::RecvJoinerDtlsRecords
                  ((JoinerSession *)&__position._M_node[1]._M_right,&dtlsRecords);
      }
      goto LAB_001a0602;
    }
    local_218 = (undefined1  [8])((ulong)((uint7)local_218._1_7_ >> 0x18) << 0x20);
    _Stack_210._M_head_impl = (Address *)0x215d0f;
    local_208 = (char *)0x28;
    aStack_200._M_allocated_capacity = 0;
    local_1f0._M_head_impl = (unsigned_short *)0x0;
    pcVar9 = "no valid Joiner Router Locator TLV found";
    aStack_200._8_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_218;
    while (pcVar9 != "") {
      cVar2 = *pcVar9;
      pcVar10 = pcVar9;
      while (cVar2 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar9,"");
          goto LAB_001a0084;
        }
        cVar2 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar9,pcVar10);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_218);
    }
LAB_001a0084:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_218;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"no valid Joiner Router Locator TLV found",
               (string_view)ZEXT816(0x28),args_00);
    peerAddr._M_dataplus._M_p._0_4_ = 8;
    std::__cxx11::string::string((string *)&peerAddr._M_string_length,(string *)&local_1d0);
  }
LAB_001a05d3:
  Error::operator=(&error,(Error *)&peerAddr);
  std::__cxx11::string::~string((string *)&peerAddr._M_string_length);
  std::__cxx11::string::~string((string *)&local_1d0);
LAB_001a0602:
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)&peerAddr,"joiner-session",(allocator *)&write_4);
    local_218._0_4_ = 0xd;
    _Stack_210._M_head_impl = (Address *)0x215e4c;
    local_208 = (char *)0x27;
    aStack_200._M_allocated_capacity = 0x100000000;
    local_1f0._M_head_impl =
         (unsigned_short *)
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar9 = "failed to handle RLY_RX.ntf message: {}";
    aStack_200._8_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_218;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_218;
    while (pcVar9 != "") {
      cVar2 = *pcVar9;
      pcVar10 = pcVar9;
      while (cVar2 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write,pcVar9,"");
          goto LAB_001a06d5;
        }
        cVar2 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)&write,pcVar9,pcVar10);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar10,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_218);
    }
LAB_001a06d5:
    Error::ToString_abi_cxx11_((string *)local_218,&error);
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_218;
    args_04.field_1.args_ = in_R9.args_;
    args_04.desc_ = (unsigned_long_long)&write;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x27;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"failed to handle RLY_RX.ntf message: {}",fmt_00,args_04);
    Log(kError,&peerAddr,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)&peerAddr);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&joinerPSKd);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&tlvSet._M_t);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::HandleRlyRx(const coap::Request &aRlyRx)
{
    Error       error;
    tlv::TlvSet tlvSet;
    tlv::TlvPtr tlv;

    std::string joinerPSKd;
    uint16_t    joinerUdpPort;
    uint16_t    joinerRouterLocator;
    ByteArray   joinerIid;
    ByteArray   joinerId;
    ByteArray   dtlsRecords;

    SuccessOrExit(error = GetTlvSet(tlvSet, aRlyRx));

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerUdpPort]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner UDP Port TLV found"));
    joinerUdpPort = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerRouterLocator]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner Router Locator TLV found"));
    joinerRouterLocator = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerIID]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner IID TLV found"));
    joinerIid = tlv->GetValue();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerDtlsEncapsulation]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner DTLS Encapsulation TLV found"));
    dtlsRecords = tlv->GetValue();

    joinerId = joinerIid;
    joinerId[0] ^= kLocalExternalAddrMask;
    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",
              utils::Hex(joinerId), joinerRouterLocator, dtlsRecords.size());

    {
        auto it = mJoinerSessions.find(joinerId);
        if (it != mJoinerSessions.end() && it->second.Disabled())
        {
            mJoinerSessions.erase(it);
            it = mJoinerSessions.end();
        }

        if (it == mJoinerSessions.end())
        {
            Address localAddr;

            joinerPSKd = mCommissionerHandler.OnJoinerRequest(joinerId);
            if (joinerPSKd.empty())
            {
                LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner(ID={}) is disabled", utils::Hex(joinerId));
                ExitNow(error = ERROR_REJECTED("joiner(ID={}) is disabled", utils::Hex(joinerId)));
            }

            SuccessOrExit(error = mBrClient.GetLocalAddr(localAddr));
            it = mJoinerSessions
                     .emplace(std::piecewise_construct, std::forward_as_tuple(joinerId),
                              std::forward_as_tuple(*this, joinerId, joinerPSKd, joinerUdpPort, joinerRouterLocator,
                                                    aRlyRx.GetEndpoint()->GetPeerAddr(),
                                                    aRlyRx.GetEndpoint()->GetPeerPort(), localAddr,
                                                    kListeningJoinerPort))
                     .first;
            auto &session = it->second;

            std::string peerAddr = session.GetPeerAddr().ToString();

            LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received a new joiner(ID={}) DTLS connection from [{}]:{}",
                      utils::Hex(joinerId), peerAddr, session.GetPeerPort());

            session.Connect();

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session timer started, expiration-time={}",
                     TimePointToString(session.GetExpirationTime()));
            mJoinerSessionTimer.Start(session.GetExpirationTime());
        }

        ASSERT(it != mJoinerSessions.end());
        auto &session = it->second;
        session.RecvJoinerDtlsRecords(dtlsRecords);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "failed to handle RLY_RX.ntf message: {}", error.ToString());
    }
}